

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

int translateKeyCode(int scancode)

{
  undefined1 uVar1;
  undefined8 *puVar2;
  KeySym *keySyms;
  int dummy;
  int keySym;
  int scancode_local;
  
  if ((scancode < 8) || (0xff < scancode)) {
    return -1;
  }
  dummy = scancode;
  if (_glfw.x11.xkb.available == 0) {
    puVar2 = (undefined8 *)XGetKeyboardMapping(_glfw.x11.display,scancode & 0xff,1,&keySyms);
    keySyms._4_4_ = (int)*puVar2;
    XFree(puVar2);
  }
  else {
    dummy._0_1_ = (undefined1)scancode;
    uVar1 = (undefined1)dummy;
    keySyms._4_4_ = XkbKeycodeToKeysym(_glfw.x11.display,uVar1,_glfw.x11.xkb.group,1);
    switch(keySyms._4_4_) {
    case 0xff8d:
      return 0x14f;
    default:
      keySyms._4_4_ = XkbKeycodeToKeysym(_glfw.x11.display,dummy & 0xff,_glfw.x11.xkb.group,0);
      break;
    case 0xffac:
    case 0xffae:
      return 0x14a;
    case 0xffb0:
      return 0x140;
    case 0xffb1:
      return 0x141;
    case 0xffb2:
      return 0x142;
    case 0xffb3:
      return 0x143;
    case 0xffb4:
      return 0x144;
    case 0xffb5:
      return 0x145;
    case 0xffb6:
      return 0x146;
    case 0xffb7:
      return 0x147;
    case 0xffb8:
      return 0x148;
    case 0xffb9:
      return 0x149;
    case 0xffbd:
      return 0x150;
    }
  }
  if (keySyms._4_4_ == 0x20) {
    return 0x20;
  }
  if (keySyms._4_4_ == 0x27) {
    return 0x27;
  }
  if (keySyms._4_4_ == 0x2c) {
    return 0x2c;
  }
  if (keySyms._4_4_ == 0x2d) {
    return 0x2d;
  }
  if (keySyms._4_4_ == 0x2e) {
    return 0x2e;
  }
  if (keySyms._4_4_ == 0x2f) {
    return 0x2f;
  }
  if (keySyms._4_4_ == 0x30) {
    return 0x30;
  }
  if (keySyms._4_4_ == 0x31) {
    return 0x31;
  }
  if (keySyms._4_4_ == 0x32) {
    return 0x32;
  }
  if (keySyms._4_4_ == 0x33) {
    return 0x33;
  }
  if (keySyms._4_4_ == 0x34) {
    return 0x34;
  }
  if (keySyms._4_4_ == 0x35) {
    return 0x35;
  }
  if (keySyms._4_4_ == 0x36) {
    return 0x36;
  }
  if (keySyms._4_4_ == 0x37) {
    return 0x37;
  }
  if (keySyms._4_4_ == 0x38) {
    return 0x38;
  }
  if (keySyms._4_4_ == 0x39) {
    return 0x39;
  }
  if (keySyms._4_4_ == 0x3b) {
    return 0x3b;
  }
  if (keySyms._4_4_ == 0x3c) {
    return 0xa1;
  }
  if (keySyms._4_4_ == 0x3d) {
    return 0x3d;
  }
  if (keySyms._4_4_ == 0x5b) {
    return 0x5b;
  }
  if (keySyms._4_4_ == 0x5c) {
    return 0x5c;
  }
  if (keySyms._4_4_ == 0x5d) {
    return 0x5d;
  }
  if (keySyms._4_4_ == 0x60) {
    return 0x60;
  }
  if (keySyms._4_4_ == 0x61) {
    return 0x41;
  }
  if (keySyms._4_4_ == 0x62) {
    return 0x42;
  }
  if (keySyms._4_4_ == 99) {
    return 0x43;
  }
  if (keySyms._4_4_ == 100) {
    return 0x44;
  }
  if (keySyms._4_4_ == 0x65) {
    return 0x45;
  }
  if (keySyms._4_4_ == 0x66) {
    return 0x46;
  }
  if (keySyms._4_4_ == 0x67) {
    return 0x47;
  }
  if (keySyms._4_4_ == 0x68) {
    return 0x48;
  }
  if (keySyms._4_4_ == 0x69) {
    return 0x49;
  }
  if (keySyms._4_4_ == 0x6a) {
    return 0x4a;
  }
  if (keySyms._4_4_ == 0x6b) {
    return 0x4b;
  }
  if (keySyms._4_4_ == 0x6c) {
    return 0x4c;
  }
  if (keySyms._4_4_ == 0x6d) {
    return 0x4d;
  }
  if (keySyms._4_4_ == 0x6e) {
    return 0x4e;
  }
  if (keySyms._4_4_ == 0x6f) {
    return 0x4f;
  }
  if (keySyms._4_4_ == 0x70) {
    return 0x50;
  }
  if (keySyms._4_4_ == 0x71) {
    return 0x51;
  }
  if (keySyms._4_4_ == 0x72) {
    return 0x52;
  }
  if (keySyms._4_4_ == 0x73) {
    return 0x53;
  }
  if (keySyms._4_4_ == 0x74) {
    return 0x54;
  }
  if (keySyms._4_4_ == 0x75) {
    return 0x55;
  }
  if (keySyms._4_4_ == 0x76) {
    return 0x56;
  }
  if (keySyms._4_4_ == 0x77) {
    return 0x57;
  }
  if (keySyms._4_4_ == 0x78) {
    return 0x58;
  }
  if (keySyms._4_4_ == 0x79) {
    return 0x59;
  }
  if (keySyms._4_4_ == 0x7a) {
    return 0x5a;
  }
  if (keySyms._4_4_ != 0xfe03) {
    if (keySyms._4_4_ == 0xff08) {
      return 0x103;
    }
    if (keySyms._4_4_ == 0xff09) {
      return 0x102;
    }
    if (keySyms._4_4_ == 0xff0d) {
      return 0x101;
    }
    if (keySyms._4_4_ == 0xff13) {
      return 0x11c;
    }
    if (keySyms._4_4_ == 0xff14) {
      return 0x119;
    }
    if (keySyms._4_4_ == 0xff1b) {
      return 0x100;
    }
    if (keySyms._4_4_ == 0xff50) {
      return 0x10c;
    }
    if (keySyms._4_4_ == 0xff51) {
      return 0x107;
    }
    if (keySyms._4_4_ == 0xff52) {
      return 0x109;
    }
    if (keySyms._4_4_ == 0xff53) {
      return 0x106;
    }
    if (keySyms._4_4_ == 0xff54) {
      return 0x108;
    }
    if (keySyms._4_4_ == 0xff55) {
      return 0x10a;
    }
    if (keySyms._4_4_ == 0xff56) {
      return 0x10b;
    }
    if (keySyms._4_4_ == 0xff57) {
      return 0x10d;
    }
    if (keySyms._4_4_ == 0xff61) {
      return 0x11b;
    }
    if (keySyms._4_4_ == 0xff63) {
      return 0x104;
    }
    if (keySyms._4_4_ == 0xff67) {
      return 0x15c;
    }
    if (keySyms._4_4_ != 0xff7e) {
      if (keySyms._4_4_ == 0xff7f) {
        return 0x11a;
      }
      if (keySyms._4_4_ == 0xff8d) {
        return 0x14f;
      }
      if (keySyms._4_4_ == 0xff95) {
        return 0x147;
      }
      if (keySyms._4_4_ == 0xff96) {
        return 0x144;
      }
      if (keySyms._4_4_ == 0xff97) {
        return 0x148;
      }
      if (keySyms._4_4_ == 0xff98) {
        return 0x146;
      }
      if (keySyms._4_4_ == 0xff99) {
        return 0x142;
      }
      if (keySyms._4_4_ == 0xff9a) {
        return 0x149;
      }
      if (keySyms._4_4_ == 0xff9b) {
        return 0x143;
      }
      if (keySyms._4_4_ == 0xff9c) {
        return 0x141;
      }
      if (keySyms._4_4_ == 0xff9e) {
        return 0x140;
      }
      if (keySyms._4_4_ == 0xff9f) {
        return 0x14a;
      }
      if (keySyms._4_4_ == 0xffaa) {
        return 0x14c;
      }
      if (keySyms._4_4_ == 0xffab) {
        return 0x14e;
      }
      if (keySyms._4_4_ == 0xffad) {
        return 0x14d;
      }
      if (keySyms._4_4_ == 0xffaf) {
        return 0x14b;
      }
      if (keySyms._4_4_ == 0xffbd) {
        return 0x150;
      }
      if (keySyms._4_4_ == 0xffbe) {
        return 0x122;
      }
      if (keySyms._4_4_ == 0xffbf) {
        return 0x123;
      }
      if (keySyms._4_4_ == 0xffc0) {
        return 0x124;
      }
      if (keySyms._4_4_ == 0xffc1) {
        return 0x125;
      }
      if (keySyms._4_4_ == 0xffc2) {
        return 0x126;
      }
      if (keySyms._4_4_ == 0xffc3) {
        return 0x127;
      }
      if (keySyms._4_4_ == 0xffc4) {
        return 0x128;
      }
      if (keySyms._4_4_ == 0xffc5) {
        return 0x129;
      }
      if (keySyms._4_4_ == 0xffc6) {
        return 0x12a;
      }
      if (keySyms._4_4_ == 0xffc7) {
        return 299;
      }
      if (keySyms._4_4_ == 0xffc8) {
        return 300;
      }
      if (keySyms._4_4_ == 0xffc9) {
        return 0x12d;
      }
      if (keySyms._4_4_ == 0xffca) {
        return 0x12e;
      }
      if (keySyms._4_4_ == 0xffcb) {
        return 0x12f;
      }
      if (keySyms._4_4_ == 0xffcc) {
        return 0x130;
      }
      if (keySyms._4_4_ == 0xffcd) {
        return 0x131;
      }
      if (keySyms._4_4_ == 0xffce) {
        return 0x132;
      }
      if (keySyms._4_4_ == 0xffcf) {
        return 0x133;
      }
      if (keySyms._4_4_ == 0xffd0) {
        return 0x134;
      }
      if (keySyms._4_4_ == 0xffd1) {
        return 0x135;
      }
      if (keySyms._4_4_ == 0xffd2) {
        return 0x136;
      }
      if (keySyms._4_4_ == 0xffd3) {
        return 0x137;
      }
      if (keySyms._4_4_ == 0xffd4) {
        return 0x138;
      }
      if (keySyms._4_4_ == 0xffd5) {
        return 0x139;
      }
      if (keySyms._4_4_ == 0xffd6) {
        return 0x13a;
      }
      if (keySyms._4_4_ == 0xffe1) {
        return 0x154;
      }
      if (keySyms._4_4_ == 0xffe2) {
        return 0x158;
      }
      if (keySyms._4_4_ == 0xffe3) {
        return 0x155;
      }
      if (keySyms._4_4_ == 0xffe4) {
        return 0x159;
      }
      if (keySyms._4_4_ == 0xffe5) {
        return 0x118;
      }
      if (keySyms._4_4_ == 0xffe7) {
        return 0x156;
      }
      if (keySyms._4_4_ != 0xffe8) {
        if (keySyms._4_4_ == 0xffe9) {
          return 0x156;
        }
        if (keySyms._4_4_ != 0xffea) {
          if (keySyms._4_4_ == 0xffeb) {
            return 0x157;
          }
          if (keySyms._4_4_ != 0xffec) {
            if (keySyms._4_4_ != 0xffff) {
              return -1;
            }
            return 0x105;
          }
          return 0x15b;
        }
      }
    }
  }
  return 0x15a;
}

Assistant:

static int translateKeyCode(int scancode)
{
    int keySym;

    // Valid key code range is  [8,255], according to the Xlib manual
    if (scancode < 8 || scancode > 255)
        return GLFW_KEY_UNKNOWN;

    if (_glfw.x11.xkb.available)
    {
        // Try secondary keysym, for numeric keypad keys
        // Note: This way we always force "NumLock = ON", which is intentional
        // since the returned key code should correspond to a physical
        // location.
        keySym = XkbKeycodeToKeysym(_glfw.x11.display, scancode, _glfw.x11.xkb.group, 1);
        switch (keySym)
        {
            case XK_KP_0:           return GLFW_KEY_KP_0;
            case XK_KP_1:           return GLFW_KEY_KP_1;
            case XK_KP_2:           return GLFW_KEY_KP_2;
            case XK_KP_3:           return GLFW_KEY_KP_3;
            case XK_KP_4:           return GLFW_KEY_KP_4;
            case XK_KP_5:           return GLFW_KEY_KP_5;
            case XK_KP_6:           return GLFW_KEY_KP_6;
            case XK_KP_7:           return GLFW_KEY_KP_7;
            case XK_KP_8:           return GLFW_KEY_KP_8;
            case XK_KP_9:           return GLFW_KEY_KP_9;
            case XK_KP_Separator:
            case XK_KP_Decimal:     return GLFW_KEY_KP_DECIMAL;
            case XK_KP_Equal:       return GLFW_KEY_KP_EQUAL;
            case XK_KP_Enter:       return GLFW_KEY_KP_ENTER;
            default:                break;
        }

        // Now try primary keysym for function keys (non-printable keys)
        // These should not depend on the current keyboard layout
        keySym = XkbKeycodeToKeysym(_glfw.x11.display, scancode, _glfw.x11.xkb.group, 0);
    }
    else
    {
        int dummy;
        KeySym* keySyms;

        keySyms = XGetKeyboardMapping(_glfw.x11.display, scancode, 1, &dummy);
        keySym = keySyms[0];
        XFree(keySyms);
    }

    switch (keySym)
    {
        case XK_Escape:         return GLFW_KEY_ESCAPE;
        case XK_Tab:            return GLFW_KEY_TAB;
        case XK_Shift_L:        return GLFW_KEY_LEFT_SHIFT;
        case XK_Shift_R:        return GLFW_KEY_RIGHT_SHIFT;
        case XK_Control_L:      return GLFW_KEY_LEFT_CONTROL;
        case XK_Control_R:      return GLFW_KEY_RIGHT_CONTROL;
        case XK_Meta_L:
        case XK_Alt_L:          return GLFW_KEY_LEFT_ALT;
        case XK_Mode_switch: // Mapped to Alt_R on many keyboards
        case XK_ISO_Level3_Shift: // AltGr on at least some machines
        case XK_Meta_R:
        case XK_Alt_R:          return GLFW_KEY_RIGHT_ALT;
        case XK_Super_L:        return GLFW_KEY_LEFT_SUPER;
        case XK_Super_R:        return GLFW_KEY_RIGHT_SUPER;
        case XK_Menu:           return GLFW_KEY_MENU;
        case XK_Num_Lock:       return GLFW_KEY_NUM_LOCK;
        case XK_Caps_Lock:      return GLFW_KEY_CAPS_LOCK;
        case XK_Print:          return GLFW_KEY_PRINT_SCREEN;
        case XK_Scroll_Lock:    return GLFW_KEY_SCROLL_LOCK;
        case XK_Pause:          return GLFW_KEY_PAUSE;
        case XK_Delete:         return GLFW_KEY_DELETE;
        case XK_BackSpace:      return GLFW_KEY_BACKSPACE;
        case XK_Return:         return GLFW_KEY_ENTER;
        case XK_Home:           return GLFW_KEY_HOME;
        case XK_End:            return GLFW_KEY_END;
        case XK_Page_Up:        return GLFW_KEY_PAGE_UP;
        case XK_Page_Down:      return GLFW_KEY_PAGE_DOWN;
        case XK_Insert:         return GLFW_KEY_INSERT;
        case XK_Left:           return GLFW_KEY_LEFT;
        case XK_Right:          return GLFW_KEY_RIGHT;
        case XK_Down:           return GLFW_KEY_DOWN;
        case XK_Up:             return GLFW_KEY_UP;
        case XK_F1:             return GLFW_KEY_F1;
        case XK_F2:             return GLFW_KEY_F2;
        case XK_F3:             return GLFW_KEY_F3;
        case XK_F4:             return GLFW_KEY_F4;
        case XK_F5:             return GLFW_KEY_F5;
        case XK_F6:             return GLFW_KEY_F6;
        case XK_F7:             return GLFW_KEY_F7;
        case XK_F8:             return GLFW_KEY_F8;
        case XK_F9:             return GLFW_KEY_F9;
        case XK_F10:            return GLFW_KEY_F10;
        case XK_F11:            return GLFW_KEY_F11;
        case XK_F12:            return GLFW_KEY_F12;
        case XK_F13:            return GLFW_KEY_F13;
        case XK_F14:            return GLFW_KEY_F14;
        case XK_F15:            return GLFW_KEY_F15;
        case XK_F16:            return GLFW_KEY_F16;
        case XK_F17:            return GLFW_KEY_F17;
        case XK_F18:            return GLFW_KEY_F18;
        case XK_F19:            return GLFW_KEY_F19;
        case XK_F20:            return GLFW_KEY_F20;
        case XK_F21:            return GLFW_KEY_F21;
        case XK_F22:            return GLFW_KEY_F22;
        case XK_F23:            return GLFW_KEY_F23;
        case XK_F24:            return GLFW_KEY_F24;
        case XK_F25:            return GLFW_KEY_F25;

        // Numeric keypad
        case XK_KP_Divide:      return GLFW_KEY_KP_DIVIDE;
        case XK_KP_Multiply:    return GLFW_KEY_KP_MULTIPLY;
        case XK_KP_Subtract:    return GLFW_KEY_KP_SUBTRACT;
        case XK_KP_Add:         return GLFW_KEY_KP_ADD;

        // These should have been detected in secondary keysym test above!
        case XK_KP_Insert:      return GLFW_KEY_KP_0;
        case XK_KP_End:         return GLFW_KEY_KP_1;
        case XK_KP_Down:        return GLFW_KEY_KP_2;
        case XK_KP_Page_Down:   return GLFW_KEY_KP_3;
        case XK_KP_Left:        return GLFW_KEY_KP_4;
        case XK_KP_Right:       return GLFW_KEY_KP_6;
        case XK_KP_Home:        return GLFW_KEY_KP_7;
        case XK_KP_Up:          return GLFW_KEY_KP_8;
        case XK_KP_Page_Up:     return GLFW_KEY_KP_9;
        case XK_KP_Delete:      return GLFW_KEY_KP_DECIMAL;
        case XK_KP_Equal:       return GLFW_KEY_KP_EQUAL;
        case XK_KP_Enter:       return GLFW_KEY_KP_ENTER;

        // Last resort: Check for printable keys (should not happen if the XKB
        // extension is available). This will give a layout dependent mapping
        // (which is wrong, and we may miss some keys, especially on non-US
        // keyboards), but it's better than nothing...
        case XK_a:              return GLFW_KEY_A;
        case XK_b:              return GLFW_KEY_B;
        case XK_c:              return GLFW_KEY_C;
        case XK_d:              return GLFW_KEY_D;
        case XK_e:              return GLFW_KEY_E;
        case XK_f:              return GLFW_KEY_F;
        case XK_g:              return GLFW_KEY_G;
        case XK_h:              return GLFW_KEY_H;
        case XK_i:              return GLFW_KEY_I;
        case XK_j:              return GLFW_KEY_J;
        case XK_k:              return GLFW_KEY_K;
        case XK_l:              return GLFW_KEY_L;
        case XK_m:              return GLFW_KEY_M;
        case XK_n:              return GLFW_KEY_N;
        case XK_o:              return GLFW_KEY_O;
        case XK_p:              return GLFW_KEY_P;
        case XK_q:              return GLFW_KEY_Q;
        case XK_r:              return GLFW_KEY_R;
        case XK_s:              return GLFW_KEY_S;
        case XK_t:              return GLFW_KEY_T;
        case XK_u:              return GLFW_KEY_U;
        case XK_v:              return GLFW_KEY_V;
        case XK_w:              return GLFW_KEY_W;
        case XK_x:              return GLFW_KEY_X;
        case XK_y:              return GLFW_KEY_Y;
        case XK_z:              return GLFW_KEY_Z;
        case XK_1:              return GLFW_KEY_1;
        case XK_2:              return GLFW_KEY_2;
        case XK_3:              return GLFW_KEY_3;
        case XK_4:              return GLFW_KEY_4;
        case XK_5:              return GLFW_KEY_5;
        case XK_6:              return GLFW_KEY_6;
        case XK_7:              return GLFW_KEY_7;
        case XK_8:              return GLFW_KEY_8;
        case XK_9:              return GLFW_KEY_9;
        case XK_0:              return GLFW_KEY_0;
        case XK_space:          return GLFW_KEY_SPACE;
        case XK_minus:          return GLFW_KEY_MINUS;
        case XK_equal:          return GLFW_KEY_EQUAL;
        case XK_bracketleft:    return GLFW_KEY_LEFT_BRACKET;
        case XK_bracketright:   return GLFW_KEY_RIGHT_BRACKET;
        case XK_backslash:      return GLFW_KEY_BACKSLASH;
        case XK_semicolon:      return GLFW_KEY_SEMICOLON;
        case XK_apostrophe:     return GLFW_KEY_APOSTROPHE;
        case XK_grave:          return GLFW_KEY_GRAVE_ACCENT;
        case XK_comma:          return GLFW_KEY_COMMA;
        case XK_period:         return GLFW_KEY_PERIOD;
        case XK_slash:          return GLFW_KEY_SLASH;
        case XK_less:           return GLFW_KEY_WORLD_1; // At least in some layouts...
        default:                break;
    }

    // No matching translation was found
    return GLFW_KEY_UNKNOWN;
}